

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_global.c
# Opt level: O3

int collectionEach(mpt_collection *c,mpt_item_handler_t *handler,void *ctx)

{
  int iVar1;
  _mpt_vptr_collection *p_Var2;
  _mpt_vptr_collection cvptr;
  _node_collection col;
  _mpt_vptr_collection local_48;
  mpt_collection local_40;
  _func_int_mpt_collection_ptr_mpt_item_handler_t_ptr_void_ptr *local_38;
  
  local_48.each = collectionEach;
  p_Var2 = c[1]._vptr;
  if (p_Var2 != (_mpt_vptr_collection *)0x0) {
    do {
      local_38 = p_Var2[4].each;
      local_40._vptr = &local_48;
      iVar1 = (*handler)(ctx,(mpt_identifier *)(p_Var2 + 5),(mpt_convertable *)p_Var2->each,
                         &local_40);
      if (iVar1 < 0) {
        return iVar1;
      }
      p_Var2 = (_mpt_vptr_collection *)p_Var2[1].each;
    } while (p_Var2 != (_mpt_vptr_collection *)0x0);
  }
  return 0;
}

Assistant:

static int collectionEach(const MPT_INTERFACE(collection) *c, MPT_TYPE(item_handler) handler, void *ctx)
{
	struct _node_collection *col = (void *) c;
	MPT_STRUCT(node) *n;
	const MPT_INTERFACE_VPTR(collection) cvptr = { collectionEach };
	
	if (!(n = col->n)) {
		return 0;
	}
	while (n) {
		struct _node_collection col = { { &cvptr }, n->children };
		int ret = handler(ctx, &n->ident, (MPT_INTERFACE(convertable) *) n->_meta, &col.col);
		if (ret < 0) {
			return ret;
		}
		n = n->next;
	}
	return 0;
}